

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_notification(lys_ypr_ctx *pctx,lysc_node_notif *notif)

{
  ulong local_50;
  uint local_3c;
  lysc_node *local_30;
  lysc_node *data;
  ulong uStack_20;
  ly_bool flag;
  uint64_t u;
  lysc_node_notif *notif_local;
  lys_ypr_ctx *pctx_local;
  
  data._7_1_ = '\0';
  if (((pctx->field_0).field_0.options & 2) == 0) {
    local_3c = (uint)(pctx->field_0).field_0.level << 1;
  }
  else {
    local_3c = 0;
  }
  u = (uint64_t)notif;
  notif_local = (lysc_node_notif *)pctx;
  ly_print_((pctx->field_0).field_0.out,"%*snotification %s",(ulong)local_3c,"",
            (notif->field_0).node.name);
  *(short *)((long)&notif_local->field_0 + 8) = *(short *)((long)&notif_local->field_0 + 8) + 1;
  yprc_extension_instances
            ((lys_ypr_ctx *)notif_local,LY_STMT_NOTIFICATION,'\0',*(lysc_ext_instance **)(u + 0x40),
             (ly_bool *)((long)&data + 7));
  uStack_20 = 0;
  while( true ) {
    if (*(long *)(u + 0x58) == 0) {
      local_50 = 0;
    }
    else {
      local_50 = *(ulong *)(*(long *)(u + 0x58) + -8);
    }
    if (local_50 <= uStack_20) break;
    yprc_must((lys_ypr_ctx *)notif_local,(lysc_must *)(*(long *)(u + 0x58) + uStack_20 * 0x38),
              (ly_bool *)((long)&data + 7));
    uStack_20 = uStack_20 + 1;
  }
  ypr_status((lys_ypr_ctx *)notif_local,*(uint16_t *)(u + 2),*(void **)(u + 0x40),
             (ly_bool *)((long)&data + 7));
  ypr_description((lys_ypr_ctx *)notif_local,*(char **)(u + 0x30),*(void **)(u + 0x40),
                  (ly_bool *)((long)&data + 7));
  ypr_reference((lys_ypr_ctx *)notif_local,*(char **)(u + 0x38),*(void **)(u + 0x40),
                (ly_bool *)((long)&data + 7));
  if (((undefined1  [80])notif_local->field_0 & (undefined1  [80])0x1000000000) ==
      (undefined1  [80])0x0) {
    for (local_30 = *(lysc_node **)(u + 0x50); local_30 != (lysc_node *)0x0;
        local_30 = local_30->next) {
      ypr_open(*(ly_out **)&notif_local->field_0,(ly_bool *)((long)&data + 7));
      yprc_node((lys_ypr_ctx *)notif_local,local_30);
    }
  }
  *(short *)((long)&notif_local->field_0 + 8) = *(short *)((long)&notif_local->field_0 + 8) + -1;
  ypr_close((lys_ypr_ctx *)notif_local,data._7_1_);
  return;
}

Assistant:

static void
yprc_notification(struct lys_ypr_ctx *pctx, const struct lysc_node_notif *notif)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;
    struct lysc_node *data;

    ly_print_(pctx->out, "%*snotification %s", INDENT, notif->name);

    LEVEL++;
    yprc_extension_instances(pctx, LY_STMT_NOTIFICATION, 0, notif->exts, &flag);

    LY_ARRAY_FOR(notif->musts, u) {
        yprc_must(pctx, &notif->musts[u], &flag);
    }
    ypr_status(pctx, notif->flags, notif->exts, &flag);
    ypr_description(pctx, notif->dsc, notif->exts, &flag);
    ypr_reference(pctx, notif->ref, notif->exts, &flag);

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        LY_LIST_FOR(notif->child, data) {
            ypr_open(pctx->out, &flag);
            yprc_node(pctx, data);
        }
    }

    LEVEL--;
    ypr_close(pctx, flag);
}